

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O2

int mbedtls_ecp_check_pub_priv(mbedtls_ecp_keypair *pub,mbedtls_ecp_keypair *prv)

{
  mbedtls_ecp_group_id mVar1;
  int iVar2;
  mbedtls_mpi *Y;
  mbedtls_mpi *Y_00;
  mbedtls_ecp_point Q;
  mbedtls_ecp_group grp;
  mbedtls_ecp_point local_170;
  mbedtls_ecp_group local_128;
  
  mVar1 = (pub->grp).id;
  if (mVar1 == MBEDTLS_ECP_DP_NONE) {
    return -0x4f80;
  }
  if (mVar1 != (prv->grp).id) {
    return -0x4f80;
  }
  iVar2 = mbedtls_mpi_cmp_mpi(&(pub->Q).X,&(prv->Q).X);
  if (iVar2 != 0) {
    return -0x4f80;
  }
  Y_00 = &(prv->Q).Y;
  iVar2 = mbedtls_mpi_cmp_mpi(&(pub->Q).Y,Y_00);
  if (iVar2 == 0) {
    Y = &(prv->Q).Z;
    iVar2 = mbedtls_mpi_cmp_mpi(&(pub->Q).Z,Y);
    if (iVar2 == 0) {
      mbedtls_ecp_point_init(&local_170);
      memset(&local_128,0,0xf8);
      mbedtls_ecp_group_copy(&local_128,&prv->grp);
      iVar2 = mbedtls_ecp_mul(&local_128,&local_170,&prv->d,&(prv->grp).G,
                              (_func_int_void_ptr_uchar_ptr_size_t *)0x0,(void *)0x0);
      if (iVar2 == 0) {
        iVar2 = mbedtls_mpi_cmp_mpi(&local_170.X,&(prv->Q).X);
        if (((iVar2 == 0) && (iVar2 = mbedtls_mpi_cmp_mpi(&local_170.Y,Y_00), iVar2 == 0)) &&
           (iVar2 = mbedtls_mpi_cmp_mpi(&local_170.Z,Y), iVar2 == 0)) {
          iVar2 = 0;
        }
        else {
          iVar2 = -0x4f80;
        }
      }
      mbedtls_ecp_point_free(&local_170);
      mbedtls_ecp_group_free(&local_128);
      return iVar2;
    }
    return -0x4f80;
  }
  return -0x4f80;
}

Assistant:

int mbedtls_ecp_check_pub_priv( const mbedtls_ecp_keypair *pub, const mbedtls_ecp_keypair *prv )
{
    int ret;
    mbedtls_ecp_point Q;
    mbedtls_ecp_group grp;

    if( pub->grp.id == MBEDTLS_ECP_DP_NONE ||
        pub->grp.id != prv->grp.id ||
        mbedtls_mpi_cmp_mpi( &pub->Q.X, &prv->Q.X ) ||
        mbedtls_mpi_cmp_mpi( &pub->Q.Y, &prv->Q.Y ) ||
        mbedtls_mpi_cmp_mpi( &pub->Q.Z, &prv->Q.Z ) )
    {
        return( MBEDTLS_ERR_ECP_BAD_INPUT_DATA );
    }

    mbedtls_ecp_point_init( &Q );
    mbedtls_ecp_group_init( &grp );

    /* mbedtls_ecp_mul() needs a non-const group... */
    mbedtls_ecp_group_copy( &grp, &prv->grp );

    /* Also checks d is valid */
    MBEDTLS_MPI_CHK( mbedtls_ecp_mul( &grp, &Q, &prv->d, &prv->grp.G, NULL, NULL ) );

    if( mbedtls_mpi_cmp_mpi( &Q.X, &prv->Q.X ) ||
        mbedtls_mpi_cmp_mpi( &Q.Y, &prv->Q.Y ) ||
        mbedtls_mpi_cmp_mpi( &Q.Z, &prv->Q.Z ) )
    {
        ret = MBEDTLS_ERR_ECP_BAD_INPUT_DATA;
        goto cleanup;
    }

cleanup:
    mbedtls_ecp_point_free( &Q );
    mbedtls_ecp_group_free( &grp );

    return( ret );
}